

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O0

void ggml_compute_forward_conv_transpose_2d(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  long lVar13;
  int64_t iVar14;
  size_t sVar15;
  long lVar16;
  void *pvVar17;
  int32_t iVar18;
  int iVar19;
  size_t __n;
  long lVar20;
  long lVar21;
  ggml_tensor *in_RSI;
  int *in_RDI;
  undefined1 auVar22 [16];
  float v;
  int i00_1;
  int i01_1;
  int i1n;
  int i10_1;
  int i11_1;
  ggml_fp16_t *wdata_kernel;
  float *dst_data_2;
  int i2;
  ggml_fp16_t *wdata_src;
  ggml_fp16_t *wdata;
  int ip1;
  int ip0;
  int dp;
  int np;
  int32_t stride;
  int i10;
  ggml_fp16_t *dst_data_1;
  float *src_1;
  int i11;
  int i12;
  ggml_fp16_t *wdata_2;
  int64_t i00;
  int64_t i01;
  ggml_fp16_t *dst_data;
  ggml_fp16_t *src;
  int64_t i02;
  int64_t i03;
  ggml_fp16_t *wdata_1;
  int nk;
  int nth;
  int ith;
  size_t nb3;
  size_t nb2;
  size_t nb1;
  size_t nb0;
  int64_t ne3;
  int64_t ne2;
  int64_t ne1;
  int64_t ne0;
  size_t nb13;
  size_t nb12;
  size_t nb11;
  size_t nb10;
  int64_t ne13;
  int64_t ne12;
  int64_t ne11;
  int64_t ne10;
  size_t nb03;
  size_t nb02;
  size_t nb01;
  size_t nb00;
  int64_t ne03;
  int64_t ne02;
  int64_t ne01;
  int64_t ne00;
  ggml_tensor *src1;
  ggml_tensor *src0;
  undefined4 in_stack_fffffffffffffe14;
  int in_stack_fffffffffffffe18;
  int local_1dc;
  undefined4 in_stack_fffffffffffffe30;
  float fVar23;
  undefined4 in_stack_fffffffffffffe34;
  int local_1c8;
  int local_1c0;
  int local_1bc;
  int local_1a4;
  int local_14c;
  int local_138;
  int local_134;
  long local_128;
  long local_120;
  long local_108;
  long local_100;
  
  pgVar1 = in_RSI->src[0];
  pgVar2 = in_RSI->src[1];
  if (pgVar1->type != GGML_TYPE_F16) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x175c,"GGML_ASSERT(%s) failed","src0->type == GGML_TYPE_F16");
  }
  if (pgVar2->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x175d,"GGML_ASSERT(%s) failed","src1->type == GGML_TYPE_F32");
  }
  if (in_RSI->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x175e,"GGML_ASSERT(%s) failed","dst->type == GGML_TYPE_F32");
  }
  lVar3 = pgVar1->ne[0];
  lVar4 = pgVar1->ne[1];
  lVar20 = pgVar1->ne[2];
  lVar21 = pgVar1->ne[3];
  sVar5 = pgVar1->nb[2];
  sVar6 = pgVar1->nb[3];
  lVar7 = pgVar2->ne[0];
  lVar8 = pgVar2->ne[1];
  lVar9 = pgVar2->ne[2];
  sVar10 = pgVar2->nb[0];
  sVar11 = pgVar2->nb[1];
  sVar12 = pgVar2->nb[2];
  lVar13 = in_RSI->ne[0];
  iVar14 = in_RSI->ne[2];
  sVar15 = in_RSI->nb[2];
  local_1a4 = *in_RDI;
  iVar19 = in_RDI[1];
  if (pgVar1->nb[0] != 2) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1767,"GGML_ASSERT(%s) failed","nb00 == sizeof(ggml_fp16_t)");
  }
  if (sVar10 != 4) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1768,"GGML_ASSERT(%s) failed","nb10 == sizeof(float)");
  }
  if (local_1a4 == 0) {
    memset(*(void **)(in_RDI + 4),0,*(size_t *)(in_RDI + 2));
    lVar16 = *(long *)(in_RDI + 4);
    for (local_100 = 0; local_100 < lVar21; local_100 = local_100 + 1) {
      for (local_108 = 0; local_108 < lVar20; local_108 = local_108 + 1) {
        pvVar17 = pgVar1->data;
        for (local_120 = 0; local_120 < lVar4; local_120 = local_120 + 1) {
          for (local_128 = 0; local_128 < lVar3; local_128 = local_128 + 1) {
            *(undefined2 *)
             (lVar16 + local_108 * lVar4 * lVar3 * lVar21 * 2 +
             (local_120 * lVar3 * lVar21 + local_128 * lVar21 + local_100) * 2) =
                 *(undefined2 *)
                  ((long)pvVar17 +
                  (local_120 * lVar3 + local_128) * 2 + local_108 * sVar5 + local_100 * sVar6);
          }
        }
      }
    }
    lVar16 = *(long *)(in_RDI + 4);
    for (local_134 = 0; local_134 < lVar9; local_134 = local_134 + 1) {
      for (local_138 = 0; local_138 < lVar8; local_138 = local_138 + 1) {
        pvVar17 = pgVar2->data;
        for (local_14c = 0; local_14c < lVar7; local_14c = local_14c + 1) {
          auVar22 = vcvtps2ph_f16c(ZEXT416(*(uint *)((long)pvVar17 +
                                                    (long)local_14c * 4 +
                                                    (long)local_138 * sVar11 +
                                                    (long)local_134 * sVar12)),0);
          *(short *)(lVar16 + (long)((int)lVar3 * (int)lVar4 * (int)lVar20 * (int)lVar21) * 2 +
                     local_138 * lVar7 * lVar9 * 2 + (local_14c * lVar9 + (long)local_134) * 2) =
               auVar22._0_2_;
        }
      }
    }
    pvVar17 = in_RSI->data;
    __n = ggml_nbytes(in_RSI);
    memset(pvVar17,0,__n);
  }
  ggml_barrier((ggml_threadpool *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  iVar18 = ggml_get_op_params_i32(in_RSI,0);
  local_1dc = (int)iVar14;
  iVar19 = (local_1dc + iVar19 + -1) / iVar19;
  local_1a4 = iVar19 * local_1a4;
  if (local_1a4 + iVar19 < local_1dc) {
    local_1dc = local_1a4 + iVar19;
  }
  for (; local_1a4 < local_1dc; local_1a4 = local_1a4 + 1) {
    pvVar17 = in_RSI->data;
    lVar20 = (long)local_1a4 * sVar15;
    for (local_1bc = 0; local_1bc < lVar8; local_1bc = local_1bc + 1) {
      for (local_1c0 = 0; local_1c0 < lVar7; local_1c0 = local_1c0 + 1) {
        for (local_1c8 = 0; local_1c8 < lVar4; local_1c8 = local_1c8 + 1) {
          for (iVar19 = 0; iVar19 < lVar3; iVar19 = iVar19 + 1) {
            fVar23 = 0.0;
            ggml_vec_dot_f16(ne13._4_4_,(float *)nb10,nb11,(ggml_fp16_t *)nb12,nb13,
                             (ggml_fp16_t *)ne0,CONCAT44(in_stack_fffffffffffffe14,1),
                             in_stack_fffffffffffffe18);
            lVar21 = (local_1bc * iVar18 + local_1c8) * lVar13 + (long)(local_1c0 * iVar18) +
                     (long)iVar19;
            *(float *)((long)pvVar17 + lVar21 * 4 + lVar20) =
                 fVar23 + *(float *)((long)pvVar17 + lVar21 * 4 + lVar20);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ggml_compute_forward_conv_transpose_2d(
        const ggml_compute_params * params,
              ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];
    const ggml_tensor * src1 = dst->src[1];

    GGML_ASSERT(src0->type == GGML_TYPE_F16);
    GGML_ASSERT(src1->type == GGML_TYPE_F32);
    GGML_ASSERT( dst->type == GGML_TYPE_F32);

    GGML_TENSOR_BINARY_OP_LOCALS

    const int ith = params->ith;
    const int nth = params->nth;

    const int nk = ne00*ne01*ne02*ne03;

    GGML_ASSERT(nb00 == sizeof(ggml_fp16_t));
    GGML_ASSERT(nb10 == sizeof(float));

    if (ith == 0) {
        memset(params->wdata, 0, params->wsize);

        // permute kernel data (src0) from (Kw x Kh x Cout x Cin) to (Cin x Kw x Kh x Cout)
        {
            ggml_fp16_t * const wdata = (ggml_fp16_t *) params->wdata + 0;

            for (int64_t i03 = 0; i03 < ne03; i03++) {
                for (int64_t i02 = 0; i02 < ne02; i02++) {
                    const ggml_fp16_t * const src = (ggml_fp16_t *)((char *) src0->data + i03*nb03 + i02*nb02);
                    ggml_fp16_t * dst_data = wdata + i02*ne01*ne00*ne03;
                    for (int64_t i01 = 0; i01 < ne01; i01++) {
                        for (int64_t i00 = 0; i00 < ne00; i00++) {
                            dst_data[i01*ne00*ne03 + i00*ne03 + i03] = src[i01 * ne00 + i00];
                        }
                    }
                }
            }
        }

        // permute source data (src1) from (Sw x Sh x Cin) to (Cin x Sw x Sh)
        {
            ggml_fp16_t * const wdata = (ggml_fp16_t *) params->wdata + nk;
            for (int i12 = 0; i12 < ne12; i12++) {
                for (int i11 = 0; i11 < ne11; i11++) {
                    const float * const src = (float *)((char *) src1->data + i12*nb12 + i11*nb11);
                    ggml_fp16_t * dst_data = wdata + i11*ne10*ne12;
                    for (int i10 = 0; i10 < ne10; i10++) {
                        dst_data[i10*ne12 + i12] = GGML_FP32_TO_FP16(src[i10]);
                    }
                }
            }
        }

        memset(dst->data, 0, ggml_nbytes(dst));
    }
    ggml_barrier(params->threadpool);

    const int32_t stride = ggml_get_op_params_i32(dst, 0);

    // total patches in dst
    const int np = ne2;

    // patches per thread
    const int dp = (np + nth - 1)/nth;

    // patch range for this thread
    const int ip0 = dp*ith;
    const int ip1 = MIN(ip0 + dp, np);

    ggml_fp16_t * const wdata = (ggml_fp16_t *) params->wdata + 0;
    ggml_fp16_t * const wdata_src = wdata + nk;

    for (int i2 = ip0; i2 < ip1; i2++) { // Cout
        float * dst_data = (float *)((char *) dst->data + i2*nb2);
        ggml_fp16_t * wdata_kernel = wdata + i2*ne01*ne00*ne03;
        for (int i11 = 0; i11 < ne11; i11++) {
            for (int i10 = 0; i10 < ne10; i10++) {
                const int i1n = i11*ne10*ne12 + i10*ne12;
                for (int i01 = 0; i01 < ne01; i01++) {
                    for (int i00 = 0; i00 < ne00; i00++) {
                        float v = 0;
                        ggml_vec_dot_f16(ne03, &v, 0,
                                wdata_src + i1n, 0,
                                wdata_kernel + i01*ne00*ne03 + i00*ne03, 0, 1);
                        dst_data[(i11*stride + i01)*ne0 + i10*stride + i00] += v;
                    }
                }
            }
        }
    }
}